

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sparse-matrix.hpp
# Opt level: O1

void __thiscall
baryonyx::sparse_matrix<int>::sparse_matrix<baryonyx::itm::merged_constraint>
          (sparse_matrix<int> *this,
          vector<baryonyx::itm::merged_constraint,_std::allocator<baryonyx::itm::merged_constraint>_>
          *csts,int rows,int cols)

{
  pointer pmVar1;
  pointer pfVar2;
  pointer paVar3;
  pointer paVar4;
  sparse_matrix<int> *psVar5;
  uint uVar6;
  row_value *__tmp;
  _Tuple_impl<0UL,_int_*,_std::default_delete<int[]>_> _Var7;
  _Head_base<0UL,_int_*,_false> _Var8;
  _Head_base<0UL,_baryonyx::sparse_matrix<int>::row_value_*,_false> _Var9;
  _Head_base<0UL,_baryonyx::sparse_matrix<int>::col_value_*,_false> _Var10;
  void *__s;
  pointer *ppfVar11;
  void *__s_00;
  undefined8 extraout_RAX;
  ulong uVar12;
  long lVar13;
  _Head_base<0UL,_baryonyx::sparse_matrix<int>::row_value_*,_false> _Var14;
  _Head_base<0UL,_baryonyx::sparse_matrix<int>::col_value_*,_false> _Var15;
  ulong uVar16;
  ulong uVar17;
  pointer *__ptr;
  int iVar18;
  col_value cVar19;
  function_element *fct_elem;
  function_element *__args_2;
  uint __tmp_1;
  size_type sVar20;
  vector<access,_std::allocator<access>_> accessors;
  vector<access,_std::allocator<access>_> local_78;
  _Temporary_buffer<__gnu_cxx::__normal_iterator<access_*,_std::vector<access,_std::allocator<access>_>_>,_access>
  local_58;
  sparse_matrix<int> *local_40;
  ulong local_38;
  
  uVar17 = (ulong)(rows + 1U) * 4;
  _Var7.super__Head_base<0UL,_int_*,_false>._M_head_impl =
       (_Head_base<0UL,_int_*,_false>)operator_new__(uVar17);
  uVar16 = 0;
  memset((void *)_Var7.super__Head_base<0UL,_int_*,_false>._M_head_impl,0,uVar17);
  (this->m_rows_access).m_buffer._M_t.super___uniq_ptr_impl<int,_std::default_delete<int[]>_>._M_t.
  super__Tuple_impl<0UL,_int_*,_std::default_delete<int[]>_>.super__Head_base<0UL,_int_*,_false> =
       _Var7.super__Head_base<0UL,_int_*,_false>._M_head_impl;
  (this->m_rows_access).m_length = rows + 1U;
  uVar17 = (ulong)(cols + 1U) * 4;
  _Var8._M_head_impl = (int *)operator_new__(uVar17);
  memset(_Var8._M_head_impl,0,uVar17);
  (this->m_cols_access).m_buffer._M_t.super___uniq_ptr_impl<int,_std::default_delete<int[]>_>._M_t.
  super__Tuple_impl<0UL,_int_*,_std::default_delete<int[]>_>.super__Head_base<0UL,_int_*,_false>.
  _M_head_impl = _Var8._M_head_impl;
  (this->m_cols_access).m_length = cols + 1U;
  (this->m_rows_values).m_buffer._M_t.
  super___uniq_ptr_impl<baryonyx::sparse_matrix<int>::row_value,_std::default_delete<baryonyx::sparse_matrix<int>::row_value[]>_>
  ._M_t.
  super__Tuple_impl<0UL,_baryonyx::sparse_matrix<int>::row_value_*,_std::default_delete<baryonyx::sparse_matrix<int>::row_value[]>_>
  .super__Head_base<0UL,_baryonyx::sparse_matrix<int>::row_value_*,_false>._M_head_impl =
       (row_value *)0x0;
  (this->m_rows_values).m_length = 0;
  (this->m_cols_values).m_buffer._M_t.
  super___uniq_ptr_impl<baryonyx::sparse_matrix<int>::col_value,_std::default_delete<baryonyx::sparse_matrix<int>::col_value[]>_>
  ._M_t.
  super__Tuple_impl<0UL,_baryonyx::sparse_matrix<int>::col_value_*,_std::default_delete<baryonyx::sparse_matrix<int>::col_value[]>_>
  .super__Head_base<0UL,_baryonyx::sparse_matrix<int>::col_value_*,_false>._M_head_impl =
       (col_value *)0x0;
  (this->m_cols_values).m_length = 0;
  uVar17 = (ulong)(uint)rows;
  if (rows != 0) {
    pmVar1 = (csts->
             super__Vector_base<baryonyx::itm::merged_constraint,_std::allocator<baryonyx::itm::merged_constraint>_>
             )._M_impl.super__Vector_impl_data._M_start;
    lVar13 = 0;
    uVar16 = 0;
    do {
      uVar16 = (ulong)(uint)((int)uVar16 +
                            (int)((ulong)(*(long *)((long)&(pmVar1->elements).
                                                                                                                      
                                                  super__Vector_base<baryonyx::function_element,_std::allocator<baryonyx::function_element>_>
                                                  ._M_impl + lVar13 + 8) -
                                         *(long *)((long)&(pmVar1->elements).
                                                                                                                    
                                                  super__Vector_base<baryonyx::function_element,_std::allocator<baryonyx::function_element>_>
                                                  ._M_impl + lVar13)) >> 3));
      lVar13 = lVar13 + 0x28;
    } while (uVar17 * 0x28 != lVar13);
  }
  sVar20 = (size_type)uVar16;
  _Var9._M_head_impl = (row_value *)operator_new__(uVar16 * 8);
  if (sVar20 != 0) {
    _Var14._M_head_impl = _Var9._M_head_impl;
    do {
      (_Var14._M_head_impl)->value = -1;
      (_Var14._M_head_impl)->column = -1;
      _Var14._M_head_impl = _Var14._M_head_impl + 1;
    } while (_Var14._M_head_impl != _Var9._M_head_impl + uVar16);
  }
  (this->m_rows_values).m_buffer._M_t.
  super___uniq_ptr_impl<baryonyx::sparse_matrix<int>::row_value,_std::default_delete<baryonyx::sparse_matrix<int>::row_value[]>_>
  ._M_t.
  super__Tuple_impl<0UL,_baryonyx::sparse_matrix<int>::row_value_*,_std::default_delete<baryonyx::sparse_matrix<int>::row_value[]>_>
  .super__Head_base<0UL,_baryonyx::sparse_matrix<int>::row_value_*,_false>._M_head_impl =
       _Var9._M_head_impl;
  (this->m_rows_values).m_length = sVar20;
  _Var10._M_head_impl = (col_value *)operator_new__(uVar16 * 8);
  if (sVar20 != 0) {
    _Var15._M_head_impl = _Var10._M_head_impl;
    do {
      (_Var15._M_head_impl)->value = -1;
      (_Var15._M_head_impl)->row = -1;
      _Var15._M_head_impl = _Var15._M_head_impl + 1;
    } while (_Var15._M_head_impl != _Var10._M_head_impl + uVar16);
  }
  _Var15._M_head_impl =
       (this->m_cols_values).m_buffer._M_t.
       super___uniq_ptr_impl<baryonyx::sparse_matrix<int>::col_value,_std::default_delete<baryonyx::sparse_matrix<int>::col_value[]>_>
       ._M_t.
       super__Tuple_impl<0UL,_baryonyx::sparse_matrix<int>::col_value_*,_std::default_delete<baryonyx::sparse_matrix<int>::col_value[]>_>
       .super__Head_base<0UL,_baryonyx::sparse_matrix<int>::col_value_*,_false>._M_head_impl;
  (this->m_cols_values).m_buffer._M_t.
  super___uniq_ptr_impl<baryonyx::sparse_matrix<int>::col_value,_std::default_delete<baryonyx::sparse_matrix<int>::col_value[]>_>
  ._M_t.
  super__Tuple_impl<0UL,_baryonyx::sparse_matrix<int>::col_value_*,_std::default_delete<baryonyx::sparse_matrix<int>::col_value[]>_>
  .super__Head_base<0UL,_baryonyx::sparse_matrix<int>::col_value_*,_false>._M_head_impl =
       _Var10._M_head_impl;
  (this->m_cols_values).m_length = sVar20;
  if (_Var15._M_head_impl != (col_value *)0x0) {
    operator_delete__(_Var15._M_head_impl);
  }
  local_78.super__Vector_base<access,_std::allocator<access>_>._M_impl.super__Vector_impl_data.
  _M_start = (access *)0x0;
  local_78.super__Vector_base<access,_std::allocator<access>_>._M_impl.super__Vector_impl_data.
  _M_finish = (access *)0x0;
  local_78.super__Vector_base<access,_std::allocator<access>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  local_40 = this;
  std::vector<access,_std::allocator<access>_>::reserve(&local_78,(long)(int)sVar20);
  local_58._M_original_len._0_4_ = 0;
  if (rows != 0) {
    do {
      pmVar1 = (csts->
               super__Vector_base<baryonyx::itm::merged_constraint,_std::allocator<baryonyx::itm::merged_constraint>_>
               )._M_impl.super__Vector_impl_data._M_start;
      pfVar2 = *(pointer *)
                ((long)&pmVar1[(int)local_58._M_original_len].elements.
                        super__Vector_base<baryonyx::function_element,_std::allocator<baryonyx::function_element>_>
                        ._M_impl + 8);
      for (__args_2 = *(function_element **)
                       &pmVar1[(int)local_58._M_original_len].elements.
                        super__Vector_base<baryonyx::function_element,_std::allocator<baryonyx::function_element>_>
                        ._M_impl; __args_2 != pfVar2; __args_2 = __args_2 + 1) {
        std::
        vector<baryonyx::sparse_matrix<int>::sparse_matrix<baryonyx::itm::merged_constraint>(std::vector<baryonyx::itm::merged_constraint,std::allocator<baryonyx::itm::merged_constraint>>const&,int,int)::access,std::allocator<baryonyx::sparse_matrix<int>::sparse_matrix<baryonyx::itm::merged_constraint>(std::vector<baryonyx::itm::merged_constraint,std::allocator<baryonyx::itm::merged_constraint>>const&,int,int)::access>>
        ::emplace_back<int&,int_const&,baryonyx::function_element_const&>
                  ((vector<baryonyx::sparse_matrix<int>::sparse_matrix<baryonyx::itm::merged_constraint>(std::vector<baryonyx::itm::merged_constraint,std::allocator<baryonyx::itm::merged_constraint>>const&,int,int)::access,std::allocator<baryonyx::sparse_matrix<int>::sparse_matrix<baryonyx::itm::merged_constraint>(std::vector<baryonyx::itm::merged_constraint,std::allocator<baryonyx::itm::merged_constraint>>const&,int,int)::access>>
                    *)&local_78,(int *)&local_58,&__args_2->variable_index,__args_2);
      }
      local_58._M_original_len._0_4_ = (int)local_58._M_original_len + 1;
    } while ((int)local_58._M_original_len != rows);
  }
  uVar12 = uVar17 * 4;
  __s = operator_new__(uVar12);
  iVar18 = 0;
  memset(__s,0,uVar12);
  psVar5 = local_40;
  if (rows != 0) {
    memset(__s,0,uVar12);
  }
  paVar4 = local_78.super__Vector_base<access,_std::allocator<access>_>._M_impl.
           super__Vector_impl_data._M_finish;
  paVar3 = local_78.super__Vector_base<access,_std::allocator<access>_>._M_impl.
           super__Vector_impl_data._M_start;
  uVar6 = (local_78.super__Vector_base<access,_std::allocator<access>_>._M_impl.
           super__Vector_impl_data._M_start)->row;
  if (sVar20 != 0) {
    uVar12 = 0;
    lVar13 = 8;
    iVar18 = 0;
    do {
      if (uVar6 != *(uint *)((long)local_78.super__Vector_base<access,_std::allocator<access>_>.
                                   _M_impl.super__Vector_impl_data._M_start + lVar13 + -8)) {
        *(int *)((long)__s + (ulong)uVar6 * 4) = iVar18;
        uVar6 = *(uint *)((long)local_78.super__Vector_base<access,_std::allocator<access>_>._M_impl
                                .super__Vector_impl_data._M_start + lVar13 + -8);
        iVar18 = 0;
      }
      iVar18 = iVar18 + 1;
      *(int *)((long)&(local_78.super__Vector_base<access,_std::allocator<access>_>._M_impl.
                       super__Vector_impl_data._M_start)->row + lVar13) = (int)uVar12;
      (psVar5->m_rows_values).m_buffer._M_t.
      super___uniq_ptr_impl<baryonyx::sparse_matrix<int>::row_value,_std::default_delete<baryonyx::sparse_matrix<int>::row_value[]>_>
      ._M_t.
      super__Tuple_impl<0UL,_baryonyx::sparse_matrix<int>::row_value_*,_std::default_delete<baryonyx::sparse_matrix<int>::row_value[]>_>
      .super__Head_base<0UL,_baryonyx::sparse_matrix<int>::row_value_*,_false>._M_head_impl[uVar12]
           = (row_value)
             (((ulong)*(uint *)((long)local_78.super__Vector_base<access,_std::allocator<access>_>.
                                      _M_impl.super__Vector_impl_data._M_start + lVar13 + -4) <<
              0x20) + uVar12);
      uVar12 = uVar12 + 1;
      lVar13 = lVar13 + 0x14;
    } while (uVar16 != uVar12);
  }
  *(int *)((long)__s + (ulong)uVar6 * 4) = iVar18;
  if (rows != 0) {
    ppfVar11 = (pointer *)
               ((long)&(((csts->
                         super__Vector_base<baryonyx::itm::merged_constraint,_std::allocator<baryonyx::itm::merged_constraint>_>
                         )._M_impl.super__Vector_impl_data._M_start)->elements).
                       super__Vector_base<baryonyx::function_element,_std::allocator<baryonyx::function_element>_>
                       ._M_impl + 8);
    uVar12 = 0;
    do {
      if (*(int *)((long)__s + uVar12 * 4) !=
          (int)((ulong)((long)*ppfVar11 - (long)((_Vector_impl_data *)(ppfVar11 + -1))->_M_start) >>
               3)) {
        sparse_matrix<baryonyx::itm::merged_constraint>();
        operator_delete(local_58._M_buffer,local_58._M_len * 0x14);
        operator_delete__(__s);
        psVar5 = local_40;
        if (local_78.super__Vector_base<access,_std::allocator<access>_>._M_impl.
            super__Vector_impl_data._M_start != (access *)0x0) {
          operator_delete(local_78.super__Vector_base<access,_std::allocator<access>_>._M_impl.
                          super__Vector_impl_data._M_start,
                          (long)local_78.super__Vector_base<access,_std::allocator<access>_>._M_impl
                                .super__Vector_impl_data._M_end_of_storage -
                          (long)local_78.super__Vector_base<access,_std::allocator<access>_>._M_impl
                                .super__Vector_impl_data._M_start);
        }
        _Var10._M_head_impl =
             (psVar5->m_cols_values).m_buffer._M_t.
             super___uniq_ptr_impl<baryonyx::sparse_matrix<int>::col_value,_std::default_delete<baryonyx::sparse_matrix<int>::col_value[]>_>
             ._M_t.
             super__Tuple_impl<0UL,_baryonyx::sparse_matrix<int>::col_value_*,_std::default_delete<baryonyx::sparse_matrix<int>::col_value[]>_>
             .super__Head_base<0UL,_baryonyx::sparse_matrix<int>::col_value_*,_false>._M_head_impl;
        if (_Var10._M_head_impl != (col_value *)0x0) {
          operator_delete__(_Var10._M_head_impl);
        }
        (psVar5->m_cols_values).m_buffer._M_t.
        super___uniq_ptr_impl<baryonyx::sparse_matrix<int>::col_value,_std::default_delete<baryonyx::sparse_matrix<int>::col_value[]>_>
        ._M_t.
        super__Tuple_impl<0UL,_baryonyx::sparse_matrix<int>::col_value_*,_std::default_delete<baryonyx::sparse_matrix<int>::col_value[]>_>
        .super__Head_base<0UL,_baryonyx::sparse_matrix<int>::col_value_*,_false>._M_head_impl =
             (col_value *)0x0;
        _Var9._M_head_impl =
             (psVar5->m_rows_values).m_buffer._M_t.
             super___uniq_ptr_impl<baryonyx::sparse_matrix<int>::row_value,_std::default_delete<baryonyx::sparse_matrix<int>::row_value[]>_>
             ._M_t.
             super__Tuple_impl<0UL,_baryonyx::sparse_matrix<int>::row_value_*,_std::default_delete<baryonyx::sparse_matrix<int>::row_value[]>_>
             .super__Head_base<0UL,_baryonyx::sparse_matrix<int>::row_value_*,_false>._M_head_impl;
        if (_Var9._M_head_impl != (row_value *)0x0) {
          operator_delete__(_Var9._M_head_impl);
        }
        (psVar5->m_rows_values).m_buffer._M_t.
        super___uniq_ptr_impl<baryonyx::sparse_matrix<int>::row_value,_std::default_delete<baryonyx::sparse_matrix<int>::row_value[]>_>
        ._M_t.
        super__Tuple_impl<0UL,_baryonyx::sparse_matrix<int>::row_value_*,_std::default_delete<baryonyx::sparse_matrix<int>::row_value[]>_>
        .super__Head_base<0UL,_baryonyx::sparse_matrix<int>::row_value_*,_false>._M_head_impl =
             (row_value *)0x0;
        _Var8._M_head_impl =
             (psVar5->m_cols_access).m_buffer._M_t.
             super___uniq_ptr_impl<int,_std::default_delete<int[]>_>._M_t.
             super__Tuple_impl<0UL,_int_*,_std::default_delete<int[]>_>.
             super__Head_base<0UL,_int_*,_false>._M_head_impl;
        if (_Var8._M_head_impl != (int *)0x0) {
          operator_delete__(_Var8._M_head_impl);
        }
        (psVar5->m_cols_access).m_buffer._M_t.
        super___uniq_ptr_impl<int,_std::default_delete<int[]>_>._M_t.
        super__Tuple_impl<0UL,_int_*,_std::default_delete<int[]>_>.
        super__Head_base<0UL,_int_*,_false>._M_head_impl = (int *)0x0;
        _Var7.super__Head_base<0UL,_int_*,_false>._M_head_impl =
             (psVar5->m_rows_access).m_buffer._M_t.
             super___uniq_ptr_impl<int,_std::default_delete<int[]>_>._M_t.
             super__Tuple_impl<0UL,_int_*,_std::default_delete<int[]>_>.
             super__Head_base<0UL,_int_*,_false>;
        if (_Var7.super__Head_base<0UL,_int_*,_false>._M_head_impl != (int *)0x0) {
          operator_delete__((void *)_Var7.super__Head_base<0UL,_int_*,_false>._M_head_impl);
        }
        (psVar5->m_rows_access).m_buffer._M_t.
        super___uniq_ptr_impl<int,_std::default_delete<int[]>_>._M_t.
        super__Tuple_impl<0UL,_int_*,_std::default_delete<int[]>_>.
        super__Head_base<0UL,_int_*,_false> = (_Head_base<0UL,_int_*,_false>)0x0;
        _Unwind_Resume(extraout_RAX);
      }
      uVar12 = uVar12 + 1;
      ppfVar11 = ppfVar11 + 5;
    } while (uVar17 != uVar12);
  }
  local_38 = (ulong)(uint)rows;
  if (local_78.super__Vector_base<access,_std::allocator<access>_>._M_impl.super__Vector_impl_data.
      _M_start !=
      local_78.super__Vector_base<access,_std::allocator<access>_>._M_impl.super__Vector_impl_data.
      _M_finish) {
    lVar13 = ((long)local_78.super__Vector_base<access,_std::allocator<access>_>._M_impl.
                    super__Vector_impl_data._M_finish -
              (long)local_78.super__Vector_base<access,_std::allocator<access>_>._M_impl.
                    super__Vector_impl_data._M_start >> 2) * -0x3333333333333333;
    std::
    _Temporary_buffer<__gnu_cxx::__normal_iterator<access_*,_std::vector<access,_std::allocator<access>_>_>,_access>
    ::_Temporary_buffer(&local_58,
                        (__normal_iterator<access_*,_std::vector<access,_std::allocator<access>_>_>)
                        local_78.super__Vector_base<access,_std::allocator<access>_>._M_impl.
                        super__Vector_impl_data._M_start,(lVar13 + 1) - (lVar13 + 1 >> 0x3f) >> 1);
    if (local_58._M_buffer == (pointer)0x0) {
      std::
      __inplace_stable_sort<__gnu_cxx::__normal_iterator<baryonyx::sparse_matrix<int>::sparse_matrix<baryonyx::itm::merged_constraint>(std::vector<baryonyx::itm::merged_constraint,std::allocator<baryonyx::itm::merged_constraint>>const&,int,int)::access*,std::vector<baryonyx::sparse_matrix<int>::sparse_matrix<baryonyx::itm::merged_constraint>(std::vector<baryonyx::itm::merged_constraint,std::allocator<baryonyx::itm::merged_constraint>>const&,int,int)::access,std::allocator<baryonyx::sparse_matrix<int>::sparse_matrix<baryonyx::itm::merged_constraint>(std::vector<baryonyx::itm::merged_constraint,std::allocator<baryonyx::itm::merged_constraint>>const&,int,int)::access>>>,__gnu_cxx::__ops::_Iter_comp_iter<baryonyx::sparse_matrix<int>::sparse_matrix<baryonyx::itm::merged_constraint>(std::vector<baryonyx::itm::merged_constraint,std::allocator<baryonyx::itm::merged_constraint>>const&,int,int)::_lambda(auto:1_const&,auto:2_const&)_1_>>
                (paVar3,paVar4);
    }
    else {
      std::
      __stable_sort_adaptive<__gnu_cxx::__normal_iterator<baryonyx::sparse_matrix<int>::sparse_matrix<baryonyx::itm::merged_constraint>(std::vector<baryonyx::itm::merged_constraint,std::allocator<baryonyx::itm::merged_constraint>>const&,int,int)::access*,std::vector<baryonyx::sparse_matrix<int>::sparse_matrix<baryonyx::itm::merged_constraint>(std::vector<baryonyx::itm::merged_constraint,std::allocator<baryonyx::itm::merged_constraint>>const&,int,int)::access,std::allocator<baryonyx::sparse_matrix<int>::sparse_matrix<baryonyx::itm::merged_constraint>(std::vector<baryonyx::itm::merged_constraint,std::allocator<baryonyx::itm::merged_constraint>>const&,int,int)::access>>>,baryonyx::sparse_matrix<int>::sparse_matrix<baryonyx::itm::merged_constraint>(std::vector<baryonyx::itm::merged_constraint,std::allocator<baryonyx::itm::merged_constraint>>const&,int,int)::access*,long,__gnu_cxx::__ops::_Iter_comp_iter<baryonyx::sparse_matrix<int>::sparse_matrix<baryonyx::itm::merged_constraint>(std::vector<baryonyx::itm::merged_constraint,std::allocator<baryonyx::itm::merged_constraint>>const&,int,int)::_lambda(auto:1_const&,auto:2_const&)_1_>>
                (paVar3,paVar4);
    }
    operator_delete(local_58._M_buffer,local_58._M_len * 0x14);
  }
  uVar12 = (ulong)(uint)cols * 4;
  __s_00 = operator_new__(uVar12);
  iVar18 = 0;
  memset(__s_00,0,uVar12);
  if (cols != 0) {
    memset(__s_00,0,uVar12);
  }
  uVar6 = (local_78.super__Vector_base<access,_std::allocator<access>_>._M_impl.
           super__Vector_impl_data._M_start)->col;
  if (sVar20 != 0) {
    uVar12 = 0;
    lVar13 = 8;
    iVar18 = 0;
    do {
      if (uVar6 != *(uint *)((long)local_78.super__Vector_base<access,_std::allocator<access>_>.
                                   _M_impl.super__Vector_impl_data._M_start + lVar13 + -4)) {
        *(int *)((long)__s_00 + (ulong)uVar6 * 4) = iVar18;
        uVar6 = *(uint *)((long)local_78.super__Vector_base<access,_std::allocator<access>_>._M_impl
                                .super__Vector_impl_data._M_start + lVar13 + -4);
        iVar18 = 0;
      }
      iVar18 = iVar18 + 1;
      cVar19.row = *(int *)((long)local_78.super__Vector_base<access,_std::allocator<access>_>.
                                  _M_impl.super__Vector_impl_data._M_start + lVar13 + -8);
      cVar19.value = (psVar5->m_rows_values).m_buffer._M_t.
                     super___uniq_ptr_impl<baryonyx::sparse_matrix<int>::row_value,_std::default_delete<baryonyx::sparse_matrix<int>::row_value[]>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_baryonyx::sparse_matrix<int>::row_value_*,_std::default_delete<baryonyx::sparse_matrix<int>::row_value[]>_>
                     .super__Head_base<0UL,_baryonyx::sparse_matrix<int>::row_value_*,_false>.
                     _M_head_impl
                     [*(uint *)((long)&(local_78.super__Vector_base<access,_std::allocator<access>_>
                                        ._M_impl.super__Vector_impl_data._M_start)->row + lVar13)].
                     value;
      (psVar5->m_cols_values).m_buffer._M_t.
      super___uniq_ptr_impl<baryonyx::sparse_matrix<int>::col_value,_std::default_delete<baryonyx::sparse_matrix<int>::col_value[]>_>
      ._M_t.
      super__Tuple_impl<0UL,_baryonyx::sparse_matrix<int>::col_value_*,_std::default_delete<baryonyx::sparse_matrix<int>::col_value[]>_>
      .super__Head_base<0UL,_baryonyx::sparse_matrix<int>::col_value_*,_false>._M_head_impl[uVar12]
           = cVar19;
      uVar12 = uVar12 + 1;
      lVar13 = lVar13 + 0x14;
    } while (uVar16 != uVar12);
  }
  *(int *)((long)__s_00 + (ulong)uVar6 * 4) = iVar18;
  _Var7.super__Head_base<0UL,_int_*,_false>._M_head_impl =
       (psVar5->m_rows_access).m_buffer._M_t.super___uniq_ptr_impl<int,_std::default_delete<int[]>_>
       ._M_t.super__Tuple_impl<0UL,_int_*,_std::default_delete<int[]>_>.
       super__Head_base<0UL,_int_*,_false>;
  *(int *)_Var7.super__Head_base<0UL,_int_*,_false>._M_head_impl = 0;
  if ((int)local_38 != 0) {
    iVar18 = *(int *)_Var7.super__Head_base<0UL,_int_*,_false>._M_head_impl;
    uVar16 = 0;
    do {
      iVar18 = iVar18 + *(int *)((long)__s + uVar16 * 4);
      *(int *)((long)_Var7.super__Head_base<0UL,_int_*,_false>._M_head_impl + (uVar16 + 1) * 4) =
           iVar18;
      uVar16 = uVar16 + 1;
    } while (uVar17 != uVar16);
  }
  _Var8._M_head_impl =
       (psVar5->m_cols_access).m_buffer._M_t.super___uniq_ptr_impl<int,_std::default_delete<int[]>_>
       ._M_t.super__Tuple_impl<0UL,_int_*,_std::default_delete<int[]>_>.
       super__Head_base<0UL,_int_*,_false>._M_head_impl;
  *_Var8._M_head_impl = 0;
  if (cols != 0) {
    iVar18 = *_Var8._M_head_impl;
    uVar17 = 0;
    do {
      iVar18 = iVar18 + *(int *)((long)__s_00 + uVar17 * 4);
      _Var8._M_head_impl[uVar17 + 1] = iVar18;
      uVar17 = uVar17 + 1;
    } while ((uint)cols != uVar17);
  }
  operator_delete__(__s_00);
  operator_delete__(__s);
  if (local_78.super__Vector_base<access,_std::allocator<access>_>._M_impl.super__Vector_impl_data.
      _M_start != (access *)0x0) {
    operator_delete(local_78.super__Vector_base<access,_std::allocator<access>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_78.super__Vector_base<access,_std::allocator<access>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_78.super__Vector_base<access,_std::allocator<access>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

explicit sparse_matrix(const std::vector<Constraint>& csts,
                           const int rows,
                           const int cols)
      : m_rows_access(rows + 1)
      , m_cols_access(cols + 1)
    {
        int elem = 0;

        for (int i = 0, e = rows; i != e; ++i)
            elem += static_cast<int>(csts[i].elements.size());

        row_vector_access(elem).swap(m_rows_values);
        col_vector_access(elem).swap(m_cols_values);

        //
        // First, we build a vector of access to all elements in the matrix
        // different to 0. Then, we sort accessors according to the column id
        // then we assign a unique identifier for each accessors and then we
        // sort accessors according to the row id. This code enable the
        // construction of the r_rows_values with pointers to the
        // r_cols_values.
        //

        struct access
        {
            access() = default;

            access(int row_, int col_, function_element fct_)
              : row(row_)
              , col(col_)
              , fct(fct_)
            {}

            int row;
            int col;
            int id;
            function_element fct;
        };

        std::vector<access> accessors;
        accessors.reserve(elem);
        for (int i = 0; i != rows; ++i)
            for (const auto& fct_elem : csts[i].elements)
                accessors.emplace_back(i, fct_elem.variable_index, fct_elem);

        fixed_array<int> rinit(rows, 0);
        int row = accessors[0].row;
        int nb_row = 0;
        for (int i = 0; i != elem; ++i) {
            if (row != accessors[i].row) {
                rinit[row] = nb_row;
                nb_row = 0;
                row = accessors[i].row;
            }
            ++nb_row;

            accessors[i].id = i;
            m_rows_values[i] = { i, accessors[i].col };
        }

        rinit[row] = nb_row; /* Be sure to affect the good number of elements
                                for this constaints. */

        for (int i = 0; i != rows; ++i)
            bx_assert(rinit[i] == static_cast<int>(csts[i].elements.size()));

        // We sort the accessors to improve memory friendly access.

        std::stable_sort(
          accessors.begin(),
          accessors.end(),
          [](const auto& lhs, const auto& rhs) { return lhs.col < rhs.col; });

        fixed_array<int> cinit(cols, 0);
        int col = accessors[0].col;
        int nb_col = 0;

        for (int i = 0; i != elem; ++i) {
            if (col != accessors[i].col) {
                cinit[col] = nb_col;
                nb_col = 0;
                col = accessors[i].col;
            }
            ++nb_col;

            m_cols_values[i] = { m_rows_values[accessors[i].id].value,
                                 accessors[i].row };
        }

        cinit[col] = nb_col; /* Be sure to affect the good number of elements
                                for this constaints. */

        m_rows_access[0] = 0;
        for (int i = 0; i != rows; ++i)
            m_rows_access[i + 1] = m_rows_access[i] + rinit[i];

        m_cols_access[0] = 0;
        for (int i = 0; i != cols; ++i)
            m_cols_access[i + 1] = m_cols_access[i] + cinit[i];
    }